

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::StripAllButComments::file
          (StripAllButComments *this,AST **body,Fodder *final_fodder)

{
  AST *pAVar1;
  
  (*(this->super_FmtPass).super_CompilerPass._vptr_CompilerPass[6])();
  (*(this->super_FmtPass).super_CompilerPass._vptr_CompilerPass[1])(this,final_fodder);
  pAVar1 = &Allocator::
            make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                      ((this->super_FmtPass).super_CompilerPass.alloc,&(*body)->location,
                       &this->comments)->super_AST;
  *body = pAVar1;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  clear(final_fodder);
  return;
}

Assistant:

virtual void file(AST *&body, Fodder &final_fodder)
    {
        expr(body);
        fodder(final_fodder);
        body = alloc.make<LiteralNull>(body->location, comments);
        final_fodder.clear();
    }